

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_18d51b::Db::parseType(Db *this)

{
  char *pcVar1;
  char cVar2;
  Cache CVar3;
  byte bVar4;
  char *pcVar5;
  byte *pbVar6;
  bool bVar7;
  Node *pNVar8;
  char *pcVar9;
  NameType *pNVar10;
  _func_int **pp_Var11;
  Node *pNVar12;
  Node *pNVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  char (*args) [4];
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  StringView SVar21;
  Node *Result;
  Node *Child;
  undefined8 uStack_40;
  Node *TA_1;
  
  Result = (Node *)0x0;
  if (this->TypeCallback != (_func_void_void_ptr_char_ptr *)0x0) {
    (*this->TypeCallback)(this->TypeCallbackContext,this->First);
  }
  pcVar9 = this->First;
  pcVar5 = this->Last;
  uVar14 = (long)pcVar5 - (long)pcVar9;
  if (pcVar5 == pcVar9) goto switchD_00148fcf_caseD_42;
  cVar2 = *pcVar9;
  switch(cVar2) {
  case 'A':
    pcVar1 = pcVar9 + 1;
    this->First = pcVar1;
    if (pcVar5 == pcVar1) {
LAB_0014973f:
      pNVar8 = parseExpr(this);
      if (((pNVar8 != (Node *)0x0) && (pcVar9 = this->First, pcVar9 != this->Last)) &&
         (*pcVar9 == '_')) {
        this->First = pcVar9 + 1;
        pNVar12 = parseType(this);
        if (pNVar12 != (Node *)0x0) {
          pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar13->K = KArrayType;
          pNVar13->RHSComponentCache = Yes;
          pNVar13->ArrayCache = Yes;
          pNVar13->FunctionCache = No;
          pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185b00;
          pNVar13[1]._vptr_Node = (_func_int **)pNVar12;
          *(Node **)&pNVar13[1].K = pNVar8;
          pNVar13[2]._vptr_Node = (_func_int **)0x0;
          break;
        }
      }
LAB_00149b1a:
      pNVar13 = (Node *)0x0;
    }
    else if ((int)*pcVar1 - 0x30U < 10) {
      pNVar13 = (Node *)0x0;
      SVar21 = parseNumber(this,false);
      pcVar9 = this->First;
      if (pcVar9 != this->Last) {
        if (*pcVar9 == '_') {
          this->First = pcVar9 + 1;
          pNVar8 = parseType(this);
          if (pNVar8 != (Node *)0x0) {
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
            NodeOrString::NodeOrString((NodeOrString *)&Child,SVar21);
            pNVar13->K = KArrayType;
            pNVar13->RHSComponentCache = Yes;
            pNVar13->ArrayCache = Yes;
            pNVar13->FunctionCache = No;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185b00;
            pNVar13[1]._vptr_Node = (_func_int **)pNVar8;
            uVar17 = Child._0_4_;
            uVar18 = Child._4_4_;
            uVar19 = (undefined4)uStack_40;
            uVar20 = uStack_40._4_4_;
            goto LAB_00149735;
          }
        }
        goto LAB_00149b1a;
      }
    }
    else {
      if (*pcVar1 != '_') goto LAB_0014973f;
      this->First = pcVar9 + 2;
      pNVar8 = parseType(this);
      if (pNVar8 == (Node *)0x0) goto LAB_00149b1a;
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar13->K = KArrayType;
      pNVar13->RHSComponentCache = Yes;
      pNVar13->ArrayCache = Yes;
      pNVar13->FunctionCache = No;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185b00;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar8;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      uVar20 = 0;
LAB_00149735:
      pNVar13[1].K = (char)uVar17;
      pNVar13[1].RHSComponentCache = (char)((uint)uVar17 >> 8);
      pNVar13[1].ArrayCache = (char)((uint)uVar17 >> 0x10);
      pNVar13[1].FunctionCache = (char)((uint)uVar17 >> 0x18);
      *(undefined4 *)&pNVar13[1].field_0xc = uVar18;
      *(undefined4 *)&pNVar13[2]._vptr_Node = uVar19;
      *(undefined4 *)((long)&pNVar13[2]._vptr_Node + 4) = uVar20;
    }
    break;
  default:
    goto switchD_00148fcf_caseD_42;
  case 'C':
    this->First = pcVar9 + 1;
    pNVar8 = parseType(this);
    if (pNVar8 == (Node *)0x0) {
      return (Node *)0x0;
    }
    Result = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    Result->K = KPostfixQualifiedType;
    Result->RHSComponentCache = No;
    Result->ArrayCache = No;
    Result->FunctionCache = No;
    Result->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185cb8;
    Result[1]._vptr_Node = (_func_int **)pNVar8;
    *(char **)&Result[1].K = " complex";
    pp_Var11 = (_func_int **)0x162dc9;
    goto LAB_001493fa;
  case 'D':
    if (uVar14 < 2) {
      return (Node *)0x0;
    }
    switch(pcVar9[1]) {
    case 'O':
    case 'o':
    case 'w':
    case 'x':
      goto switchD_00148fcf_caseD_46;
    default:
      goto switchD_0014953c_caseD_50;
    case 'T':
    case 't':
      pNVar13 = parseDecltype(this);
      goto LAB_001494ef;
    case 'a':
      this->First = pcVar9 + 2;
      pcVar9 = "auto";
      goto LAB_001496d5;
    case 'c':
      this->First = pcVar9 + 2;
      pcVar9 = "decltype(auto)";
      goto LAB_001495d6;
    case 'd':
      this->First = pcVar9 + 2;
      pcVar9 = "decimal64";
      break;
    case 'e':
      this->First = pcVar9 + 2;
      pcVar9 = "decimal128";
      goto LAB_0014923e;
    case 'f':
      this->First = pcVar9 + 2;
      pcVar9 = "decimal32";
      break;
    case 'h':
      this->First = pcVar9 + 2;
      pcVar9 = "decimal16";
      break;
    case 'i':
      this->First = pcVar9 + 2;
      pcVar9 = "char32_t";
      goto LAB_001490ca;
    case 'n':
      this->First = pcVar9 + 2;
      pcVar9 = "std::nullptr_t";
LAB_001495d6:
      pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                          ((Db *)this,(char (*) [15])pcVar9);
      return &pNVar10->super_Node;
    case 'p':
      this->First = pcVar9 + 2;
      Child = parseType(this);
      if (Child == (Node *)0x0) {
        return (Node *)0x0;
      }
      Result = &(anonymous_namespace)::Db::
                make<(anonymous_namespace)::ParameterPackExpansion,(anonymous_namespace)::Node*&>
                          ((Db *)this,&Child)->super_Node;
      goto LAB_001494f8;
    case 's':
      this->First = pcVar9 + 2;
      pcVar9 = "char16_t";
LAB_001490ca:
      pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                          ((Db *)this,(char (*) [9])pcVar9);
      return &pNVar10->super_Node;
    case 'v':
      SVar21.Last = "";
      SVar21.First = "Dv";
      bVar7 = consumeIf(this,SVar21);
      if (!bVar7) goto LAB_00149b1a;
      pbVar6 = (byte *)this->First;
      if (((byte *)this->Last == pbVar6) || (bVar4 = *pbVar6, (char)bVar4 < '1')) {
LAB_00149a49:
        pNVar8 = parseExpr(this);
        if (((pNVar8 != (Node *)0x0) && (pcVar9 = this->First, pcVar9 != this->Last)) &&
           (*pcVar9 == '_')) {
          this->First = pcVar9 + 1;
          pNVar12 = parseType(this);
          if (pNVar12 != (Node *)0x0) {
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
            pNVar13->K = KVectorType;
            pNVar13->RHSComponentCache = No;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = No;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185aa8;
            pNVar13[1]._vptr_Node = (_func_int **)pNVar12;
            *(Node **)&pNVar13[1].K = pNVar8;
            pNVar13[2]._vptr_Node = (_func_int **)0x0;
            goto LAB_00149abd;
          }
        }
      }
      else {
        if (0x39 < bVar4) {
          if (bVar4 != 0x5f) goto LAB_00149a49;
          this->First = (char *)(pbVar6 + 1);
          pNVar8 = parseType(this);
          if (pNVar8 == (Node *)0x0) goto LAB_00149b1a;
          pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
          pNVar13->K = KVectorType;
          pNVar13->RHSComponentCache = No;
          pNVar13->ArrayCache = No;
          pNVar13->FunctionCache = No;
          pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185aa8;
          pNVar13[1]._vptr_Node = (_func_int **)pNVar8;
          pNVar13[1].K = KDotSuffix;
          pNVar13[1].RHSComponentCache = Yes;
          pNVar13[1].ArrayCache = Yes;
          pNVar13[1].FunctionCache = Yes;
          *(undefined4 *)&pNVar13[1].field_0xc = 0;
          pNVar13[2]._vptr_Node = (_func_int **)0x1;
LAB_00149abd:
          pNVar13[2].K = KNodeArrayNode;
          goto LAB_001494ef;
        }
        pNVar13 = (Node *)0x0;
        SVar21 = parseNumber(this,false);
        pcVar9 = this->First;
        if (pcVar9 == this->Last) goto LAB_001494ef;
        if (*pcVar9 == '_') {
          pcVar5 = pcVar9 + 1;
          this->First = pcVar5;
          if ((pcVar5 != this->Last) && (*pcVar5 == 'p')) {
            this->First = pcVar9 + 2;
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
            NodeOrString::NodeOrString((NodeOrString *)&Child,SVar21);
            pNVar13->K = KVectorType;
            pNVar13->RHSComponentCache = No;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = No;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185aa8;
            pNVar13[1]._vptr_Node = (_func_int **)0x0;
            *(Node **)&pNVar13[1].K = Child;
            pNVar13[2]._vptr_Node = uStack_40;
            pNVar13[2].K = KDotSuffix;
            goto LAB_001494ef;
          }
          pNVar8 = parseType(this);
          if (pNVar8 != (Node *)0x0) {
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
            NodeOrString::NodeOrString((NodeOrString *)&Child,SVar21);
            pNVar13->K = KVectorType;
            pNVar13->RHSComponentCache = No;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = No;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185aa8;
            pNVar13[1]._vptr_Node = (_func_int **)pNVar8;
            *(Node **)&pNVar13[1].K = Child;
            pNVar13[2]._vptr_Node = uStack_40;
            goto LAB_00149abd;
          }
        }
      }
      goto LAB_00149b1a;
    }
LAB_0014968f:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                        ((Db *)this,(char (*) [10])pcVar9);
    return &pNVar10->super_Node;
  case 'F':
    goto switchD_00148fcf_caseD_46;
  case 'G':
    this->First = pcVar9 + 1;
    pNVar8 = parseType(this);
    if (pNVar8 == (Node *)0x0) {
      return (Node *)0x0;
    }
    Result = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    Result->K = KPostfixQualifiedType;
    Result->RHSComponentCache = No;
    Result->ArrayCache = No;
    Result->FunctionCache = No;
    Result->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185cb8;
    Result[1]._vptr_Node = (_func_int **)pNVar8;
    *(char **)&Result[1].K = " imaginary";
    pp_Var11 = (_func_int **)0x162dd4;
LAB_001493fa:
    Result[2]._vptr_Node = pp_Var11;
    goto LAB_001494f8;
  case 'K':
  case 'V':
  case 'r':
    uVar16 = (ulong)(cVar2 == 'r');
    if ((uVar16 < uVar14) && (pcVar9[uVar16] == 'V')) {
      uVar16 = (ulong)((cVar2 == 'r') + 1);
    }
    uVar15 = (uint)uVar16;
    if (uVar16 < uVar14) {
      uVar15 = uVar15 + (pcVar9[uVar16] == 'K');
      uVar16 = (ulong)uVar15;
    }
    if ((uVar14 <= uVar16) ||
       ((pcVar9[uVar16] != 'F' &&
        ((((pcVar9[uVar16] != 'D' || (uVar14 <= (ulong)uVar15 + 1)) ||
          (0x29 < (byte)pcVar9[(ulong)uVar15 + 1] - 0x4f)) ||
         ((0x30100000001U >> ((ulong)((byte)pcVar9[(ulong)uVar15 + 1] - 0x4f) & 0x3f) & 1) == 0)))))
       ) goto switchD_00148fcf_caseD_55;
    goto switchD_00148fcf_caseD_46;
  case 'M':
    this->First = pcVar9 + 1;
    pNVar8 = parseType(this);
    if ((pNVar8 == (Node *)0x0) || (pNVar12 = parseType(this), pNVar12 == (Node *)0x0))
    goto LAB_00149b1a;
    pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    CVar3 = pNVar12->RHSComponentCache;
    pNVar13->K = KPointerToMemberType;
    pNVar13->RHSComponentCache = CVar3;
    pNVar13->ArrayCache = No;
    pNVar13->FunctionCache = No;
    pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185b58;
    pNVar13[1]._vptr_Node = (_func_int **)pNVar8;
    *(Node **)&pNVar13[1].K = pNVar12;
    break;
  case 'O':
    this->First = pcVar9 + 1;
    Child = parseType(this);
    if (Child == (Node *)0x0) {
      return (Node *)0x0;
    }
    TA_1 = (Node *)CONCAT44(TA_1._4_4_,1);
    goto LAB_00149610;
  case 'P':
    this->First = pcVar9 + 1;
    pNVar8 = parseType(this);
    if (pNVar8 == (Node *)0x0) {
      return (Node *)0x0;
    }
    Result = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    CVar3 = pNVar8->RHSComponentCache;
    Result->K = KPointerType;
    Result->RHSComponentCache = CVar3;
    Result->ArrayCache = No;
    Result->FunctionCache = No;
    Result->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185c08;
    Result[1]._vptr_Node = (_func_int **)pNVar8;
    goto LAB_001494f8;
  case 'R':
    this->First = pcVar9 + 1;
    Child = parseType(this);
    if (Child == (Node *)0x0) {
      return (Node *)0x0;
    }
    TA_1 = (Node *)((ulong)TA_1 & 0xffffffff00000000);
LAB_00149610:
    Result = &(anonymous_namespace)::Db::
              make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
                        ((Db *)this,&Child,(ReferenceKind *)&TA_1)->super_Node;
    goto LAB_001494f8;
  case 'S':
    if (((1 < uVar14) && (pcVar9[1] != '\0')) && (pcVar9[1] != 't')) {
      Child = parseSubstitution(this);
      if (Child == (Node *)0x0) {
        return (Node *)0x0;
      }
      if (this->TryToParseTemplateArgs != true) {
        return Child;
      }
      if (this->Last == this->First) {
        return Child;
      }
      if (*this->First != 'I') {
        return Child;
      }
      TA_1 = parseTemplateArgs(this,false);
      if (TA_1 == (Node *)0x0) {
        return (Node *)0x0;
      }
      Result = &(anonymous_namespace)::Db::
                make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                          ((Db *)this,&Child,&TA_1)->super_Node;
      goto LAB_001494f8;
    }
    goto switchD_00148fcf_caseD_42;
  case 'T':
    if (((uVar14 < 2) || (0x10 < (byte)pcVar9[1] - 0x65)) ||
       ((0x14001U >> ((byte)pcVar9[1] - 0x65 & 0x1f) & 1) == 0)) {
      Result = parseTemplateParam(this);
      if (Result == (Node *)0x0) {
        return (Node *)0x0;
      }
      if (((this->TryToParseTemplateArgs == true) && (this->Last != this->First)) &&
         (*this->First == 'I')) {
        Child = parseTemplateArgs(this,false);
        if (Child == (Node *)0x0) {
          return (Node *)0x0;
        }
        Result = &(anonymous_namespace)::Db::
                  make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                            ((Db *)this,&Result,&Child)->super_Node;
      }
      goto LAB_001494f8;
    }
switchD_00148fcf_caseD_42:
    pNVar13 = parseClassEnumType(this);
    break;
  case 'U':
switchD_00148fcf_caseD_55:
    pNVar13 = parseQualifiedType(this);
    break;
  case 'a':
    this->First = pcVar9 + 1;
    pcVar9 = "signed char";
    goto LAB_001496b2;
  case 'b':
    this->First = pcVar9 + 1;
    pcVar9 = "bool";
    goto LAB_001496d5;
  case 'c':
    this->First = pcVar9 + 1;
    pcVar9 = "char";
    goto LAB_001496d5;
  case 'd':
    this->First = pcVar9 + 1;
    pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar8->K = KNameType;
    pNVar8->RHSComponentCache = No;
    pNVar8->ArrayCache = No;
    pNVar8->FunctionCache = No;
    pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00184710;
    pNVar8[1]._vptr_Node = (_func_int **)0x162d56;
    pcVar9 = "";
    goto LAB_00149228;
  case 'e':
    this->First = pcVar9 + 1;
    pcVar9 = "long double";
LAB_001496b2:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[12]>
                        ((Db *)this,(char (*) [12])pcVar9);
    return &pNVar10->super_Node;
  case 'f':
    this->First = pcVar9 + 1;
    pcVar9 = "float";
    goto LAB_0014947c;
  case 'g':
    this->First = pcVar9 + 1;
    pcVar9 = "__float128";
LAB_0014923e:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                        ((Db *)this,(char (*) [11])pcVar9);
    return &pNVar10->super_Node;
  case 'h':
    this->First = pcVar9 + 1;
    pcVar9 = "unsigned char";
    goto LAB_00149555;
  case 'i':
    this->First = pcVar9 + 1;
    args = (char (*) [4])0x162d26;
    goto LAB_0014933c;
  case 'j':
    this->First = pcVar9 + 1;
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[13]>
                        ((Db *)this,(char (*) [13])"unsigned int");
    return &pNVar10->super_Node;
  case 'l':
    this->First = pcVar9 + 1;
    pcVar9 = "long";
    goto LAB_001496d5;
  case 'm':
    this->First = pcVar9 + 1;
    pcVar9 = "unsigned long";
LAB_00149555:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[14]>
                        ((Db *)this,(char (*) [14])pcVar9);
    return &pNVar10->super_Node;
  case 'n':
    this->First = pcVar9 + 1;
    pcVar9 = "__int128";
    goto LAB_001490ca;
  case 'o':
    this->First = pcVar9 + 1;
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[18]>
                        ((Db *)this,(char (*) [18])"unsigned __int128");
    return &pNVar10->super_Node;
  case 's':
    this->First = pcVar9 + 1;
    pcVar9 = "short";
LAB_0014947c:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[6]>
                        ((Db *)this,(char (*) [6])pcVar9);
    return &pNVar10->super_Node;
  case 't':
    this->First = pcVar9 + 1;
    pcVar9 = "unsigned short";
    goto LAB_001495d6;
  case 'u':
    this->First = pcVar9 + 1;
    _Child = parseBareSourceName(this);
    if (Child == Child._8_8_) {
      return (Node *)0x0;
    }
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,StringView&>
                        ((Db *)this,(StringView *)&Child);
    return &pNVar10->super_Node;
  case 'v':
    this->First = pcVar9 + 1;
    pcVar9 = "void";
LAB_001496d5:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[5]>
                        ((Db *)this,(char (*) [5])pcVar9);
    return &pNVar10->super_Node;
  case 'w':
    this->First = pcVar9 + 1;
    pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar8->K = KNameType;
    pNVar8->RHSComponentCache = No;
    pNVar8->ArrayCache = No;
    pNVar8->FunctionCache = No;
    pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00184710;
    pNVar8[1]._vptr_Node = (_func_int **)"wchar_t";
    pcVar9 = "";
    goto LAB_00149228;
  case 'x':
    this->First = pcVar9 + 1;
    pcVar9 = "long long";
    goto LAB_0014968f;
  case 'y':
    this->First = pcVar9 + 1;
    pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar8->K = KNameType;
    pNVar8->RHSComponentCache = No;
    pNVar8->ArrayCache = No;
    pNVar8->FunctionCache = No;
    pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00184710;
    pNVar8[1]._vptr_Node = (_func_int **)"unsigned long long";
    pcVar9 = "";
LAB_00149228:
    *(char **)&pNVar8[1].K = pcVar9;
    return pNVar8;
  case 'z':
    this->First = pcVar9 + 1;
    args = (char (*) [4])0x1625dc;
LAB_0014933c:
    pNVar10 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[4]>
                        ((Db *)this,args);
    return &pNVar10->super_Node;
  }
LAB_001494ef:
  Result = pNVar13;
  if (pNVar13 == (Node *)0x0) {
switchD_0014953c_caseD_50:
    return (Node *)0x0;
  }
LAB_001494f8:
  pNVar8 = Result;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&Result);
  return pNVar8;
switchD_00148fcf_caseD_46:
  pNVar13 = parseFunctionType(this);
  goto LAB_001494ef;
}

Assistant:

Node *Db::parseType() {
  Node *Result = nullptr;

  if (TypeCallback != nullptr)
    TypeCallback(TypeCallbackContext, First);

  switch (look()) {
  //             ::= <qualified-type>
  case 'r':
  case 'V':
  case 'K': {
    unsigned AfterQuals = 0;
    if (look(AfterQuals) == 'r') ++AfterQuals;
    if (look(AfterQuals) == 'V') ++AfterQuals;
    if (look(AfterQuals) == 'K') ++AfterQuals;

    if (look(AfterQuals) == 'F' ||
        (look(AfterQuals) == 'D' &&
         (look(AfterQuals + 1) == 'o' || look(AfterQuals + 1) == 'O' ||
          look(AfterQuals + 1) == 'w' || look(AfterQuals + 1) == 'x'))) {
      Result = parseFunctionType();
      break;
    }
    LLVM_FALLTHROUGH;
  }
  case 'U': {
    Result = parseQualifiedType();
    break;
  }
  // <builtin-type> ::= v    # void
  case 'v':
    ++First;
    return make<NameType>("void");
  //                ::= w    # wchar_t
  case 'w':
    ++First;
    return make<NameType>("wchar_t");
  //                ::= b    # bool
  case 'b':
    ++First;
    return make<NameType>("bool");
  //                ::= c    # char
  case 'c':
    ++First;
    return make<NameType>("char");
  //                ::= a    # signed char
  case 'a':
    ++First;
    return make<NameType>("signed char");
  //                ::= h    # unsigned char
  case 'h':
    ++First;
    return make<NameType>("unsigned char");
  //                ::= s    # short
  case 's':
    ++First;
    return make<NameType>("short");
  //                ::= t    # unsigned short
  case 't':
    ++First;
    return make<NameType>("unsigned short");
  //                ::= i    # int
  case 'i':
    ++First;
    return make<NameType>("int");
  //                ::= j    # unsigned int
  case 'j':
    ++First;
    return make<NameType>("unsigned int");
  //                ::= l    # long
  case 'l':
    ++First;
    return make<NameType>("long");
  //                ::= m    # unsigned long
  case 'm':
    ++First;
    return make<NameType>("unsigned long");
  //                ::= x    # long long, __int64
  case 'x':
    ++First;
    return make<NameType>("long long");
  //                ::= y    # unsigned long long, __int64
  case 'y':
    ++First;
    return make<NameType>("unsigned long long");
  //                ::= n    # __int128
  case 'n':
    ++First;
    return make<NameType>("__int128");
  //                ::= o    # unsigned __int128
  case 'o':
    ++First;
    return make<NameType>("unsigned __int128");
  //                ::= f    # float
  case 'f':
    ++First;
    return make<NameType>("float");
  //                ::= d    # double
  case 'd':
    ++First;
    return make<NameType>("double");
  //                ::= e    # long double, __float80
  case 'e':
    ++First;
    return make<NameType>("long double");
  //                ::= g    # __float128
  case 'g':
    ++First;
    return make<NameType>("__float128");
  //                ::= z    # ellipsis
  case 'z':
    ++First;
    return make<NameType>("...");

  // <builtin-type> ::= u <source-name>    # vendor extended type
  case 'u': {
    ++First;
    StringView Res = parseBareSourceName();
    if (Res.empty())
      return nullptr;
    return make<NameType>(Res);
  }
  case 'D':
    switch (look(1)) {
    //                ::= Dd   # IEEE 754r decimal floating point (64 bits)
    case 'd':
      First += 2;
      return make<NameType>("decimal64");
    //                ::= De   # IEEE 754r decimal floating point (128 bits)
    case 'e':
      First += 2;
      return make<NameType>("decimal128");
    //                ::= Df   # IEEE 754r decimal floating point (32 bits)
    case 'f':
      First += 2;
      return make<NameType>("decimal32");
    //                ::= Dh   # IEEE 754r half-precision floating point (16 bits)
    case 'h':
      First += 2;
      return make<NameType>("decimal16");
    //                ::= Di   # char32_t
    case 'i':
      First += 2;
      return make<NameType>("char32_t");
    //                ::= Ds   # char16_t
    case 's':
      First += 2;
      return make<NameType>("char16_t");
    //                ::= Da   # auto (in dependent new-expressions)
    case 'a':
      First += 2;
      return make<NameType>("auto");
    //                ::= Dc   # decltype(auto)
    case 'c':
      First += 2;
      return make<NameType>("decltype(auto)");
    //                ::= Dn   # std::nullptr_t (i.e., decltype(nullptr))
    case 'n':
      First += 2;
      return make<NameType>("std::nullptr_t");

    //             ::= <decltype>
    case 't':
    case 'T': {
      Result = parseDecltype();
      break;
    }
    // extension   ::= <vector-type> # <vector-type> starts with Dv
    case 'v': {
      Result = parseVectorType();
      break;
    }
    //           ::= Dp <type>       # pack expansion (C++0x)
    case 'p': {
      First += 2;
      Node *Child = parseType();
      if (!Child)
        return nullptr;
      Result = make<ParameterPackExpansion>(Child);
      break;
    }
    // Exception specifier on a function type.
    case 'o':
    case 'O':
    case 'w':
    // Transaction safe function type.
    case 'x':
      Result = parseFunctionType();
      break;
    }
    break;
  //             ::= <function-type>
  case 'F': {
    Result = parseFunctionType();
    break;
  }
  //             ::= <array-type>
  case 'A': {
    Result = parseArrayType();
    break;
  }
  //             ::= <pointer-to-member-type>
  case 'M': {
    Result = parsePointerToMemberType();
    break;
  }
  //             ::= <template-param>
  case 'T': {
    // This could be an elaborate type specifier on a <class-enum-type>.
    if (look(1) == 's' || look(1) == 'u' || look(1) == 'e') {
      Result = parseClassEnumType();
      break;
    }

    Result = parseTemplateParam();
    if (Result == nullptr)
      return nullptr;

    // Result could be either of:
    //   <type>        ::= <template-param>
    //   <type>        ::= <template-template-param> <template-args>
    //
    //   <template-template-param> ::= <template-param>
    //                             ::= <substitution>
    //
    // If this is followed by some <template-args>, and we're permitted to
    // parse them, take the second production.

    if (TryToParseTemplateArgs && look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      Result = make<NameWithTemplateArgs>(Result, TA);
    }
    break;
  }
  //             ::= P <type>        # pointer
  case 'P': {
    ++First;
    Node *Ptr = parseType();
    if (Ptr == nullptr)
      return nullptr;
    Result = make<PointerType>(Ptr);
    break;
  }
  //             ::= R <type>        # l-value reference
  case 'R': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::LValue);
    break;
  }
  //             ::= O <type>        # r-value reference (C++11)
  case 'O': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::RValue);
    break;
  }
  //             ::= C <type>        # complex pair (C99)
  case 'C': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return nullptr;
    Result = make<PostfixQualifiedType>(P, " complex");
    break;
  }
  //             ::= G <type>        # imaginary (C99)
  case 'G': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return P;
    Result = make<PostfixQualifiedType>(P, " imaginary");
    break;
  }
  //             ::= <substitution>  # See Compression below
  case 'S': {
    if (look(1) && look(1) != 't') {
      Node *Sub = parseSubstitution();
      if (Sub == nullptr)
        return nullptr;

      // Sub could be either of:
      //   <type>        ::= <substitution>
      //   <type>        ::= <template-template-param> <template-args>
      //
      //   <template-template-param> ::= <template-param>
      //                             ::= <substitution>
      //
      // If this is followed by some <template-args>, and we're permitted to
      // parse them, take the second production.

      if (TryToParseTemplateArgs && look() == 'I') {
        Node *TA = parseTemplateArgs();
        if (TA == nullptr)
          return nullptr;
        Result = make<NameWithTemplateArgs>(Sub, TA);
        break;
      }

      // If all we parsed was a substitution, don't re-insert into the
      // substitution table.
      return Sub;
    }
    LLVM_FALLTHROUGH;
  }
  //        ::= <class-enum-type>
  default: {
    Result = parseClassEnumType();
    break;
  }
  }

  // If we parsed a type, insert it into the substitution table. Note that all
  // <builtin-type>s and <substitution>s have already bailed out, because they
  // don't get substitutions.
  if (Result != nullptr)
    Subs.push_back(Result);
  return Result;
}